

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

int Wlc_ObjDup(Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,int iObj,Vec_Int_t *vFanins)

{
  ushort uVar1;
  int iVar2;
  Wlc_Obj_t *pWVar3;
  Wlc_Obj_t *pObjNew;
  int iFaninNew;
  Wlc_Obj_t *pObj;
  Vec_Int_t *vFanins_local;
  int iObj_local;
  Wlc_Ntk_t *p_local;
  Wlc_Ntk_t *pNew_local;
  
  pWVar3 = Wlc_NtkObj(p,iObj);
  uVar1 = *(ushort *)pWVar3;
  iVar2 = Wlc_ObjIsSigned(pWVar3);
  iVar2 = Wlc_ObjAlloc(pNew,(uint)(uVar1 & 0x3f),iVar2,pWVar3->End,pWVar3->Beg);
  pWVar3 = Wlc_NtkObj(pNew,iVar2);
  Wlc_ObjCollectCopyFanins(p,iObj,vFanins);
  Wlc_ObjAddFanins(pNew,pWVar3,vFanins);
  Wlc_ObjSetCopy(p,iObj,iVar2);
  return iVar2;
}

Assistant:

int Wlc_ObjDup( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, int iObj, Vec_Int_t * vFanins )
{
    Wlc_Obj_t * pObj = Wlc_NtkObj( p, iObj );
    int iFaninNew = Wlc_ObjAlloc( pNew, pObj->Type, Wlc_ObjIsSigned(pObj), pObj->End, pObj->Beg );
    Wlc_Obj_t * pObjNew = Wlc_NtkObj(pNew, iFaninNew);
    Wlc_ObjCollectCopyFanins( p, iObj, vFanins );
    Wlc_ObjAddFanins( pNew, pObjNew, vFanins );
    Wlc_ObjSetCopy( p, iObj, iFaninNew );
    return iFaninNew;
}